

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_ldpc_file_formats.hpp
# Opt level: O1

pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
* __thiscall
LDPC4QKD::read_matrix_from_cscmat<unsigned_int,unsigned_int>
          (pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
           *__return_storage_ptr__,LDPC4QKD *this,string *file_path)

{
  char cVar1;
  char cVar2;
  istream *piVar3;
  runtime_error *this_00;
  string current_line;
  vector<unsigned_int,_std::allocator<unsigned_int>_> rowval;
  vector<unsigned_int,_std::allocator<unsigned_int>_> colptr;
  ifstream fs;
  string local_288;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_268;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_250;
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream((istream *)local_238,(string *)this,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Stream object invalid.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_288._M_string_length = 0;
  local_288.field_2._M_local_buf[0] = '\0';
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  do {
    cVar2 = (char)(istream *)local_238;
    cVar1 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + cVar2);
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)&local_288,cVar1);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
  } while (*local_288._M_dataplus._M_p == '#');
  cVar2 = std::ios::widen(cVar2 + (char)*(undefined8 *)(local_238[0] + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_238,(string *)&local_288,cVar2);
  cVar2 = std::ios::widen((char)(istream *)local_238 + (char)*(undefined8 *)(local_238[0] + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_238,(string *)&local_288,cVar2);
  HelpersReadFilesLDPC::helper_parse_space_sep_ints<unsigned_int>(&local_250,&local_288);
  cVar2 = std::ios::widen((char)(istream *)local_238 + (char)*(undefined8 *)(local_238[0] + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_238,(string *)&local_288,cVar2);
  cVar2 = std::ios::widen((char)(istream *)local_238 + (char)*(undefined8 *)(local_238[0] + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_238,(string *)&local_288,cVar2);
  HelpersReadFilesLDPC::helper_parse_space_sep_ints<unsigned_int>(&local_268,&local_288);
  std::
  pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  ::
  pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&,_true>
            (__return_storage_ptr__,&local_250,&local_268);
  if (local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_250.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_250.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_250.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_250.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,
                    CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                             local_288.field_2._M_local_buf[0]) + 1);
  }
  std::ifstream::~ifstream(local_238);
  return __return_storage_ptr__;
}

Assistant:

std::pair <std::vector<colptr_t>, std::vector<idx_t>> read_matrix_from_cscmat(const std::string &file_path) {
        try {
            std::ifstream fs(file_path);
            if (!fs) {
                throw std::runtime_error("Stream object invalid.");
            }

            std::string current_line;

            while (getline(fs, current_line) && current_line[0] == '#') {
                // Do nothing. Ignores comments at the beginning of the file.
            }

            getline(fs, current_line); // ignores metadata
            getline(fs, current_line);
            std::vector<colptr_t> colptr = HelpersReadFilesLDPC::helper_parse_space_sep_ints<colptr_t>(current_line);

            getline(fs, current_line); // ignores empty line
            getline(fs, current_line);
            std::vector<idx_t> rowval = HelpersReadFilesLDPC::helper_parse_space_sep_ints<idx_t>(current_line);

            return std::make_pair(colptr, rowval);
        }
        catch (const std::exception &e) {
            std::stringstream s;
            s << "Failed to read LDPC code from file '" << file_path << "'. Reason:\n" << e.what() << "\n";
            throw std::runtime_error(s.str());
        }
        catch (...) {
            std::stringstream s;
            s << "Failed to read LDPC code from file '" << file_path << "' due to unknown error.";
            throw std::runtime_error(s.str());
        }
    }